

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
UnaryExpr<const_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::streamReconstructedExpression
          (UnaryExpr<const_std::__cxx11::basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *this,ostream *os)

{
  string local_30 [32];
  
  std::__cxx11::string::string
            (local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Detail::unprintableString_abi_cxx11_);
  std::operator<<(os,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }